

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void FunctionalTester<int,_void>::Test(void)

{
  int *arg;
  char local_a8 [8];
  buf_t buf1;
  buf_t buf2;
  TestWatcher<int> tw;
  
  TestWatcher<int>::TestWatcher((TestWatcher<int> *)(buf2._M_elems + 0x3f));
  for (buf2._M_elems._56_4_ = -0x80000000; buf2._M_elems._56_4_ != 0x7fffffff;
      buf2._M_elems._56_4_ = buf2._M_elems._56_4_ + 1) {
    int2str::convert_with_zero<int,char*>(buf2._M_elems._56_4_,local_a8);
    boost::lexical_cast<std::array<char,64ul>,int>
              ((array<char,_64UL> *)(buf1._M_elems + 0x38),(boost *)(buf2._M_elems + 0x38),arg);
    StrcmpAndExit(local_a8,buf1._M_elems + 0x38);
  }
  TestWatcher<int>::~TestWatcher((TestWatcher<int> *)(buf2._M_elems + 0x3f));
  return;
}

Assistant:

static void Test()
    {
        TestWatcher<T> const tw;
        typedef std::array<char, 64> buf_t;
        buf_t buf1;
        T const imin = std::numeric_limits<T>::min();
        T const imax = std::numeric_limits<T>::max();
        for (T i = imin; i < imax; ++i)
        {
            int2str::convert_with_zero(i, buf1.data());
#ifdef USE_BOOST
            buf_t buf2 = boost::lexical_cast<buf_t>(i);
#else
            buf_t buf2;
            sprintf(buf2.data(), PrintfFormat<T>(), i);
#endif
            StrcmpAndExit(buf1.data(), buf2.data());
        }
    }